

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_type(lyout *out,int level,lys_module *module,lys_type *type)

{
  char cVar1;
  byte bVar2;
  lys_type *plVar3;
  lyout *out_00;
  int iVar4;
  lys_module *plVar5;
  char *pcVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_restr *restr;
  lys_type_bit *plVar9;
  ulong uVar10;
  long lVar11;
  int attr_value;
  char *local_78;
  char *s;
  ulong local_68;
  ulong local_60;
  lys_type *local_58;
  lys_module *local_50;
  lyout *local_48;
  int local_3c;
  int local_38;
  int content2;
  int content;
  
  local_38 = 0;
  local_3c = 0;
  iVar4 = lys_type_is_local(type);
  local_50 = module;
  if (iVar4 == 0) {
    plVar5 = lys_main_module(type->der->module);
    pcVar6 = transform_module_name2import_prefix(module,plVar5->name);
    ly_print(out,"%*s<type name=\"%s:%s\"",(ulong)(uint)(level * 2),"",pcVar6,type->der->name);
  }
  else {
    yin_print_open(out,level,(char *)0x0,"type","name",type->der->name,0);
  }
  iVar4 = level + 1;
  local_60 = (ulong)(uint)level;
  if (type->ext_size != '\0') {
    yin_print_close_parent(out,&local_38);
    yin_print_extension_instances
              (out,iVar4,local_50,LYEXT_SUBSTMT_SELF,'\0',type->ext,(uint)type->ext_size);
  }
  local_48 = out;
  content2 = iVar4;
  switch(type->base) {
  case LY_TYPE_BINARY:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) break;
    yin_print_close_parent(out,&local_38);
    restr = (type->info).dec64.range;
    pcVar6 = "length";
    goto LAB_00185614;
  case LY_TYPE_BITS:
    s._4_4_ = (int)local_60 + 2;
    lVar11 = 0;
    uVar10 = 0;
    local_58 = type;
    while (plVar3 = local_58, uVar10 < (local_58->info).bits.count) {
      local_3c = 0;
      local_68 = uVar10;
      yin_print_close_parent(out,&local_38);
      yin_print_open(out,content2,(char *)0x0,"bit","name",
                     *(char **)((long)&((plVar3->info).bits.bit)->name + lVar11),local_3c);
      plVar5 = local_50;
      iVar4 = s._4_4_;
      yin_print_snode_common
                (out,s._4_4_,(lys_node *)((long)&((plVar3->info).bits.bit)->name + lVar11),local_50,
                 &local_3c,3);
      plVar9 = (plVar3->info).bits.bit;
      if ((*(byte *)((long)&plVar9->flags + lVar11) & 1) == 0) {
        yin_print_close_parent(out,&local_3c);
        plVar3 = local_58;
        plVar9 = (local_58->info).bits.bit;
        yin_print_unsigned(out,iVar4,LYEXT_SUBSTMT_POSITION,'\0',plVar5,
                           *(lys_ext_instance ***)((long)&plVar9->ext + lVar11),
                           (uint)(&plVar9->ext_size)[lVar11],*(uint *)((long)&plVar9->pos + lVar11))
        ;
        plVar9 = (plVar3->info).bits.bit;
      }
      yin_print_snode_common
                (out,iVar4,(lys_node *)((long)&plVar9->name + lVar11),plVar5,&local_3c,0x70);
      yin_print_close(out,content2,(char *)0x0,"bit",local_3c);
      lVar11 = lVar11 + 0x30;
      uVar10 = local_68 + 1;
    }
    break;
  case LY_TYPE_DEC64:
    if ((type->der->type).der == (lys_tpdf *)0x0) {
      yin_print_close_parent(out,&local_38);
      yin_print_unsigned(out,content2,LYEXT_SUBSTMT_DIGITS,'\0',local_50,type->ext,
                         (uint)type->ext_size,(uint)(type->info).dec64.dig);
    }
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    out = local_48;
    if ((type->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(local_48,&local_38);
      restr = (type->info).dec64.range;
      pcVar6 = "range";
LAB_00185614:
      yin_print_typerestr(out,content2,local_50,restr,pcVar6);
    }
    break;
  case LY_TYPE_ENUM:
    local_58 = (lys_type *)CONCAT44(local_58._4_4_,(int)local_60 + 2);
    lVar11 = 0;
    uVar10 = 0;
    while (uVar10 < (type->info).bits.count) {
      local_3c = 0;
      local_68 = uVar10;
      yin_print_close_parent(out,&local_38);
      yin_print_open(out,content2,(char *)0x0,"enum","name",
                     *(char **)((long)&((type->info).bits.bit)->name + lVar11),local_3c);
      plVar5 = local_50;
      iVar4 = (int)local_58;
      yin_print_snode_common
                (out,(int)local_58,(lys_node *)((long)&((type->info).bits.bit)->name + lVar11),
                 local_50,&local_3c,3);
      plVar9 = (type->info).bits.bit;
      if ((*(byte *)((long)&plVar9->flags + lVar11) & 1) == 0) {
        attr_value = 0x1857f9;
        yin_print_close_parent(out,&local_3c);
        plVar9 = (type->info).bits.bit;
        yin_print_signed(out,iVar4,LYEXT_SUBSTMT_SELF,(uint8_t)plVar5,
                         *(lys_module **)((long)&plVar9->ext + lVar11),
                         (lys_ext_instance **)(ulong)(&plVar9->ext_size)[lVar11],
                         *(uint *)((long)&plVar9->pos + lVar11),attr_value);
        plVar9 = (type->info).bits.bit;
      }
      yin_print_snode_common
                (out,iVar4,(lys_node *)((long)&plVar9->name + lVar11),plVar5,&local_3c,0x70);
      yin_print_close(out,content2,(char *)0x0,"enum",local_3c);
      lVar11 = lVar11 + 0x30;
      uVar10 = local_68 + 1;
    }
    break;
  case LY_TYPE_IDENT:
    if ((type->info).bits.count != 0) {
      yin_print_close_parent(out,&local_38);
      plVar5 = local_50;
      for (uVar10 = 0; uVar10 < (type->info).bits.count; uVar10 = uVar10 + 1) {
        plVar7 = lys_main_module(*(lys_module **)((&((type->info).bits.bit)->name)[uVar10] + 0x30));
        plVar8 = lys_main_module(plVar5);
        if (plVar8 == plVar7) {
          pcVar6 = (&((type->info).bits.bit)->name)[uVar10];
          yin_print_substmt(local_48,content2,LYEXT_SUBSTMT_BASE,'\0',*(char **)pcVar6,plVar5,
                            *(lys_ext_instance ***)(pcVar6 + 0x20),(uint)(byte)pcVar6[0x1a]);
        }
        else {
          pcVar6 = transform_module_name2import_prefix(plVar5,plVar7->name);
          iVar4 = asprintf(&local_78,"%s:%s",pcVar6);
          if (iVar4 == -1) {
            ly_log(plVar5->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_print_type")
            ;
          }
          else {
            pcVar6 = (&((type->info).bits.bit)->name)[uVar10];
            yin_print_substmt(local_48,content2,LYEXT_SUBSTMT_BASE,'\0',local_78,plVar5,
                              *(lys_ext_instance ***)(pcVar6 + 0x20),(uint)(byte)pcVar6[0x1a]);
            free(local_78);
          }
        }
      }
    }
    break;
  case LY_TYPE_INST:
    cVar1 = (type->info).inst.req;
    if (cVar1 == -1) {
      yin_print_close_parent(out,&local_38);
      bVar2 = type->ext_size;
      pcVar6 = "false";
      plVar5 = local_50;
    }
    else {
LAB_00185b91:
      out = local_48;
      if (cVar1 != '\x01') break;
      yin_print_close_parent(local_48,&local_38);
      bVar2 = type->ext_size;
      pcVar6 = "true";
      plVar5 = local_50;
    }
    goto LAB_00185be5;
  case LY_TYPE_LEAFREF:
    iVar4 = ly_strequal_(type->der->name,"leafref");
    out = local_48;
    plVar5 = local_50;
    if (iVar4 != 0) {
      yin_print_close_parent(local_48,&local_38);
      pcVar6 = transform_json2schema(plVar5,(type->info).lref.path);
      yin_print_substmt(out,content2,LYEXT_SUBSTMT_PATH,'\0',pcVar6,plVar5,type->ext,
                        (uint)type->ext_size);
      lydict_remove(plVar5->ctx,pcVar6);
    }
    cVar1 = (type->info).lref.req;
    if (cVar1 != -1) goto LAB_00185b91;
    yin_print_close_parent(out,&local_38);
    bVar2 = type->ext_size;
    pcVar6 = "false";
LAB_00185be5:
    yin_print_substmt(out,content2,LYEXT_SUBSTMT_REQINSTANCE,'\0',pcVar6,plVar5,type->ext,
                      (uint)bVar2);
    break;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit != (lys_type_bit *)0x0) {
      yin_print_close_parent(out,&local_38);
      yin_print_typerestr(out,content2,local_50,(type->info).dec64.range,"length");
    }
    out_00 = local_48;
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < (type->info).str.pat_count; uVar10 = uVar10 + 1) {
      yin_print_close_parent(out_00,&local_38);
      yin_print_typerestr(out_00,content2,local_50,
                          (lys_restr *)(((type->info).lref.target)->padding + lVar11 + -0x1c),
                          "pattern");
      lVar11 = lVar11 + 0x38;
    }
    break;
  case LY_TYPE_UNION:
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < (type->info).bits.count; uVar10 = uVar10 + 1) {
      yin_print_close_parent(out,&local_38);
      yin_print_type(out,content2,local_50,
                     (lys_type *)((long)&((type->info).bits.bit)->name + lVar11));
      lVar11 = lVar11 + 0x40;
    }
  }
  yin_print_close(local_48,(int)local_60,(char *)0x0,"type",local_38);
  return;
}

Assistant:

static void
yin_print_type(struct lyout *out, int level, const struct lys_module *module, const struct lys_type *type)
{
    unsigned int i;
    int content = 0, content2 = 0;
    const char *str;
    char *s;
    struct lys_module *mod;

    if (!lys_type_is_local(type)) {
        ly_print(out, "%*s<type name=\"%s:%s\"", LEVEL, INDENT,
                 transform_module_name2import_prefix(module, lys_main_module(type->der->module)->name), type->der->name);
    } else {
        yin_print_open(out, level, NULL, "type", "name", type->der->name, content);
    }
    level++;

    /* extensions */
    if (type->ext_size) {
        yin_print_close_parent(out, &content);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, type->ext, type->ext_size);
    }


    switch (type->base) {
    case LY_TYPE_BINARY:
        if (type->info.binary.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.binary.length, "length");
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "bit", "name", type->info.bits.bit[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.bits.bit[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_unsigned(out, level + 1, LYEXT_SUBSTMT_POSITION, 0, module,
                                   type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                   type->info.bits.bit[i].pos);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "bit", content2);
        }
        break;
    case LY_TYPE_DEC64:
        if (!type->der->type.der) {
            yin_print_close_parent(out, &content);
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_DIGITS, 0, module,
                               type->ext, type->ext_size, type->info.dec64.dig);
        }
        if (type->info.dec64.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.dec64.range, "range");
        }
        break;
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "enum", "name", type->info.enums.enm[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.enums.enm[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_signed(out, level + 1, LYEXT_SUBSTMT_VALUE, 0, module,
                                 type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                 type->info.enums.enm[i].value);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "enum", content2);
        }
        break;
    case LY_TYPE_IDENT:
        if (type->info.ident.count) {
            yin_print_close_parent(out, &content);
            for (i = 0; i < type->info.ident.count; ++i) {
                mod = lys_main_module(type->info.ident.ref[i]->module);
                if (lys_main_module(module) == mod) {
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, type->info.ident.ref[i]->name,
                                      module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                } else {
                    if (asprintf(&s, "%s:%s", transform_module_name2import_prefix(module, mod->name),
                                 type->info.ident.ref[i]->name) == -1) {
                        LOGMEM(module->ctx);
                    } else {
                        yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, s,
                                          module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                        free(s);
                    }
                }
            }
        }
        break;
    case LY_TYPE_INST:
        if (type->info.inst.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.inst.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (type->info.num.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.num.range, "range");
        }
        break;
    case LY_TYPE_LEAFREF:
        if (ly_strequal(type->der->name, "leafref", 0)) {
            yin_print_close_parent(out, &content);
            str = transform_json2schema(module, type->info.lref.path);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_PATH, 0, str, module, type->ext, type->ext_size);
            lydict_remove(module->ctx, str);
        }
        if (type->info.lref.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.lref.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.str.length, "length");
        }
        for (i = 0; i < type->info.str.pat_count; i++) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, &type->info.str.patterns[i], "pattern");
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            yin_print_close_parent(out, &content);
            yin_print_type(out, level, module, &type->info.uni.types[i]);
        }
        break;
    default:
        /* other types do not have substatements */
        break;
    }

    level--;
    yin_print_close(out, level, NULL, "type", content);
}